

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O3

void Abc_TruthRpoTest(char *pFileName,int nVarNum,int nThreshold,int fVerbose)

{
  uint uVar1;
  word *pwVar2;
  Rpo_TtStore_t *p;
  word **ppwVar3;
  char *__ptr;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  char cVar12;
  char *pcVar13;
  byte *pbVar14;
  byte bVar15;
  long lVar16;
  int nTruths;
  int nVars;
  uint local_38;
  uint local_34;
  
  if (nVarNum < 0) {
    Abc_TruthGetParams(pFileName,(int *)&local_34,(int *)&local_38);
    if (local_34 - 2 < 0xf && local_38 != 0) {
      lVar9 = (long)(int)local_38;
      p = (Rpo_TtStore_t *)malloc(0x18);
      bVar4 = (char)local_34 - 6;
      uVar1 = 1 << (bVar4 & 0x1f);
      if (local_34 < 7) {
        uVar1 = 1;
      }
      p->nVars = local_34;
      p->nWords = uVar1;
      p->nFuncs = local_38;
      bVar15 = bVar4;
      if (local_34 < 7) {
        bVar15 = 0;
      }
      ppwVar3 = (word **)malloc(((ulong)uVar1 * 8 + 8) * lVar9);
      p->pFuncs = ppwVar3;
      *ppwVar3 = (word *)(ppwVar3 + lVar9);
      memset(ppwVar3 + lVar9,0,lVar9 << (bVar15 + 3 & 0x3f));
      if (1 < (int)local_38) {
        pwVar2 = *ppwVar3;
        uVar6 = 1;
        do {
          pwVar2 = pwVar2 + uVar1;
          ppwVar3[uVar6] = pwVar2;
          uVar6 = uVar6 + 1;
        } while (local_38 != uVar6);
      }
      __ptr = Abc_FileRead(pFileName);
      if (__ptr != (char *)0x0) {
        cVar12 = *__ptr;
        lVar9 = 0;
        if (cVar12 != '\n') {
          uVar1 = 0x10 << (bVar4 & 0x1f);
          if (local_34 < 7) {
            uVar1 = 0x10;
          }
          lVar9 = 0;
          lVar16 = 0;
          pcVar13 = __ptr;
          do {
            if (cVar12 == '0') {
              pcVar13 = pcVar13 + (ulong)(pcVar13[1] == 'x') * 2;
            }
            if ((0x20 < (ulong)(byte)pcVar13[(int)uVar1]) ||
               ((0x100002401U >> ((ulong)(byte)pcVar13[(int)uVar1] & 0x3f) & 1) == 0)) {
              __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                            ,0x6d,"void Abc_TruthReadHex(word *, char *, int)");
            }
            if (0 < (int)uVar1) {
              pwVar2 = ppwVar3[lVar9];
              pbVar14 = (byte *)(pcVar13 + (long)(int)uVar1 + -1);
              bVar4 = 0;
              uVar6 = 0;
              do {
                bVar15 = *pbVar14;
                iVar7 = -0x30;
                if (9 < (byte)(bVar15 - 0x30)) {
                  if ((byte)(bVar15 + 0xbf) < 6) {
                    iVar7 = -0x37;
                  }
                  else {
                    iVar7 = -0x57;
                    if (5 < (byte)(bVar15 + 0x9f)) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                                    ,0x51,"int Abc_TruthReadHexDigit(char)");
                    }
                  }
                }
                pwVar2[uVar6 >> 4 & 0xfffffff] =
                     pwVar2[uVar6 >> 4 & 0xfffffff] |
                     (ulong)(iVar7 + (uint)bVar15) << (bVar4 & 0x3c);
                uVar6 = uVar6 + 1;
                bVar4 = bVar4 + 4;
                pbVar14 = pbVar14 + -1;
              } while (uVar1 != uVar6);
            }
            lVar9 = lVar9 + 1;
            lVar5 = lVar16 << 0x20;
            lVar16 = (long)(int)lVar16;
            do {
              pcVar13 = __ptr + lVar16;
              lVar16 = lVar16 + 1;
              lVar5 = lVar5 + 0x100000000;
            } while (*pcVar13 != '\n');
            pcVar13 = __ptr + (lVar5 >> 0x20);
            cVar12 = __ptr[lVar5 >> 0x20];
          } while (cVar12 != '\n');
        }
        if ((int)local_38 < (int)lVar9) {
          __assert_fail("p->nFuncs >= nLines",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                        ,0x101,"void Abc_TruthStoreRead(char *, Rpo_TtStore_t *)");
        }
        p->nFuncs = (int)lVar9;
        free(__ptr);
      }
    }
    else {
      p = (Rpo_TtStore_t *)0x0;
    }
  }
  else {
    uVar1 = Abc_FileSize(pFileName);
    uVar11 = 1 << ((char)nVarNum - 3U & 0x1f);
    uVar6 = (long)(int)uVar1 / (long)(int)uVar11;
    uVar10 = (long)(int)uVar1 % (long)(int)uVar11;
    if (uVar1 == 0xffffffff) {
      p = (Rpo_TtStore_t *)0x0;
    }
    else {
      if ((uint)nVarNum < 6) {
        __assert_fail("nVarNum >= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                      ,0x141,"Rpo_TtStore_t *Abc_TtStoreLoad(char *, int)");
      }
      if ((int)uVar10 != 0) {
        Abc_Print(0,
                  "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n"
                  ,(ulong)uVar1,(ulong)uVar11,uVar10 & 0xffffffff);
      }
      pwVar2 = (word *)Abc_FileRead(pFileName);
      p = (Rpo_TtStore_t *)malloc(0x18);
      p->nVars = nVarNum;
      iVar7 = 1 << ((char)nVarNum - 6U & 0x1f);
      p->nWords = iVar7;
      iVar8 = (int)uVar6;
      p->nFuncs = iVar8;
      ppwVar3 = (word **)malloc((long)iVar8 << 3);
      p->pFuncs = ppwVar3;
      *ppwVar3 = pwVar2;
      if (1 < iVar8) {
        pwVar2 = *ppwVar3;
        uVar10 = 1;
        do {
          pwVar2 = pwVar2 + iVar7;
          ppwVar3[uVar10] = pwVar2;
          uVar10 = uVar10 + 1;
        } while ((uVar6 & 0xffffffff) != uVar10);
      }
    }
  }
  if (fVerbose == 0) {
    fVerbose = 0;
  }
  else {
    Abc_Print(-2,"Number of variables = %d\n",(ulong)(uint)p->nVars);
  }
  Abc_TruthRpoPerform(p,nThreshold,fVerbose);
  ppwVar3 = p->pFuncs;
  if (nVarNum < 0) {
    if (ppwVar3 == (word **)0x0) goto LAB_0029d577;
  }
  else if (*ppwVar3 != (word *)0x0) {
    free(*ppwVar3);
    ppwVar3 = p->pFuncs;
    *ppwVar3 = (word *)0x0;
  }
  free(ppwVar3);
LAB_0029d577:
  free(p);
  return;
}

Assistant:

void Abc_TruthRpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose) {
    Rpo_TtStore_t * p;

    // allocate data-structure
//    if (fVerbose) {
//        Abc_Print(-2, "Number of variables = %d\n", nVarNum);
//    }
    p = Abc_TtStoreLoad(pFileName, nVarNum);

    if (fVerbose) {
        Abc_Print(-2, "Number of variables = %d\n", p->nVars);
    }
    // consider functions from the file
    Abc_TruthRpoPerform(p, nThreshold, fVerbose);

    // delete data-structure
    Abc_TtStoreFree(p, nVarNum);
    //    printf( "Finished decomposing truth tables from file \"%s\".\n", pFileName );
}